

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall
cmDebugServerJson::ProcessRequest
          (cmDebugServerJson *this,cmConnection *connection,string *jsonRequest)

{
  cmDebugger *pcVar1;
  mutex_type *pmVar2;
  bool bVar3;
  __type _Var4;
  Int IVar5;
  Value *pVVar6;
  cmMakefile *pcVar7;
  char *pcVar8;
  long lVar9;
  cmWatchpoint *watchpoint;
  pointer __x;
  mutex_type *pmVar10;
  undefined8 uVar11;
  string requestVal;
  allocator local_289;
  cmPauseContext ctx;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> watchpoints;
  Value value;
  string request;
  Value local_200;
  Value local_1d8;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Reader reader;
  
  Json::Reader::Reader(&reader);
  Json::Value::Value(&value,nullValue);
  bVar3 = Json::Reader::parse(&reader,jsonRequest,&value,true);
  if (!bVar3) goto LAB_00428268;
  pVVar6 = Json::Value::operator[](&value,"Command");
  Json::Value::asString_abi_cxx11_(&request,pVVar6);
  bVar3 = std::operator==(&request,"Break");
  lVar9 = 0xa8;
  if (bVar3) {
LAB_00428025:
    (**(code **)((long)((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->
                       _vptr_cmDebugger + lVar9))();
  }
  else {
    lVar9 = std::__cxx11::string::find((char *)&request,0x5237b6);
    if (lVar9 == 0) {
      lVar9 = 0x88;
      goto LAB_00428025;
    }
    lVar9 = std::__cxx11::string::find((char *)&request,0x5237c7);
    if (lVar9 == 0) {
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      pVVar6 = Json::Value::operator[](&value,"File");
      Json::Value::asString_abi_cxx11_(&requestVal,pVVar6);
      pVVar6 = Json::Value::operator[](&value,"Line");
      IVar5 = Json::Value::asInt(pVVar6);
      (*pcVar1->_vptr_cmDebugger[0x10])(pcVar1,&requestVal,(long)IVar5);
LAB_00428251:
      std::__cxx11::string::~string((string *)&requestVal);
    }
    else {
      lVar9 = std::__cxx11::string::find((char *)&request,0x5237dd);
      if (lVar9 == 0) {
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        pVVar6 = Json::Value::operator[](&value,"File");
        Json::Value::asString_abi_cxx11_(&requestVal,pVVar6);
        pVVar6 = Json::Value::operator[](&value,"Line");
        IVar5 = Json::Value::asInt(pVVar6);
        (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,&requestVal,(long)IVar5);
        goto LAB_00428251;
      }
      lVar9 = std::__cxx11::string::find((char *)&request,0x5237eb);
      if (lVar9 == 0) {
        pVVar6 = Json::Value::operator[](&value,"Type");
        Json::Value::asString_abi_cxx11_(&requestVal,pVVar6);
        bVar3 = std::operator==(&requestVal,"Read");
        if (bVar3) {
          uVar11 = 4;
        }
        else {
          bVar3 = std::operator==(&requestVal,"All");
          uVar11 = 2;
          if (bVar3) {
            uVar11 = 0xf;
          }
        }
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        pVVar6 = Json::Value::operator[](&value,"Expr");
        Json::Value::asString_abi_cxx11_((string *)&watchpoints,pVVar6);
        (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,&watchpoints,uVar11);
        std::__cxx11::string::~string((string *)&watchpoints);
        goto LAB_00428251;
      }
      lVar9 = std::__cxx11::string::find((char *)&request,0x523807);
      if (lVar9 == 0) {
        pVVar6 = Json::Value::operator[](&value,"Expr");
        Json::Value::asString_abi_cxx11_(&requestVal,pVVar6);
        (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[8])
                  (&watchpoints);
        ctx.Debugger = (cmDebugger *)0x0;
        ctx.Lock._M_device = (mutex_type *)0x0;
        ctx.Lock._M_owns = false;
        ctx.Lock._9_7_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ctx,
                   ((long)watchpoints.
                          super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        for (__x = watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                   _M_impl.super__Vector_impl_data._M_start; pmVar2 = ctx.Lock._M_device,
            pmVar10 = (mutex_type *)ctx.Debugger,
            __x != watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
          _Var4 = std::operator==(&__x->Variable,&requestVal);
          if (_Var4) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ctx,&__x->Id);
          }
        }
        for (; pmVar10 != pmVar2;
            pmVar10 = (mutex_type *)((long)&(pmVar10->super___recursive_mutex_base)._M_mutex + 8)) {
          pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
          (*pcVar1->_vptr_cmDebugger[0x13])
                    (pcVar1,(_func_int **)(pmVar10->super___recursive_mutex_base)._M_mutex.__align);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ctx);
        std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector(&watchpoints);
        goto LAB_00428251;
      }
      lVar9 = std::__cxx11::string::find((char *)&request,0x523818);
      if (lVar9 == 0) {
        lVar9 = 0xa0;
        goto LAB_00428025;
      }
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
                (&ctx);
      bVar3 = cmPauseContext::operator_cast_to_bool(&ctx);
      if (bVar3) {
        bVar3 = std::operator==(&request,"Continue");
        if (bVar3) {
          cmPauseContext::Continue(&ctx);
        }
        else {
          bVar3 = std::operator==(&request,"StepIn");
          if (bVar3) {
            cmPauseContext::StepIn(&ctx);
          }
          else {
            bVar3 = std::operator==(&request,"StepOut");
            if (bVar3) {
              cmPauseContext::StepOut(&ctx);
            }
            else {
              bVar3 = std::operator==(&request,"StepOver");
              if (!bVar3) {
                lVar9 = std::__cxx11::string::find((char *)&request,0x52386f);
                if (lVar9 == 0) {
                  pVVar6 = Json::Value::operator[](&value,"Request");
                  Json::Value::asString_abi_cxx11_(&requestVal,pVVar6);
                  if (((requestVal._M_string_length == 0) || (*requestVal._M_dataplus._M_p != '\"'))
                     || (requestVal._M_dataplus._M_p[requestVal._M_string_length - 1] != '\"')) {
                    pcVar7 = cmPauseContext::GetMakefile(&ctx);
                    pcVar8 = cmMakefile::GetDefinition(pcVar7,&requestVal);
                  }
                  else {
                    pcVar7 = cmPauseContext::GetMakefile(&ctx);
                    pcVar8 = cmMakefile::ExpandVariablesInString(pcVar7,&requestVal);
                  }
                  Json::Value::removeMember(&local_160,&value,"Command");
                  Json::Value::~Value(&local_160);
                  if (pcVar8 == (char *)0x0) {
                    Json::Value::Value(&local_1d8,false);
                    pVVar6 = Json::Value::operator[](&value,"Response");
                    Json::Value::operator=(pVVar6,&local_1d8);
                    Json::Value::~Value(&local_1d8);
                  }
                  else {
                    std::__cxx11::string::string((string *)&watchpoints,pcVar8,&local_289);
                    Json::Value::Value(&local_1b0,(string *)&watchpoints);
                    pVVar6 = Json::Value::operator[](&value,"Response");
                    Json::Value::operator=(pVVar6,&local_1b0);
                    Json::Value::~Value(&local_1b0);
                    std::__cxx11::string::~string((string *)&watchpoints);
                  }
                  Json::Value::toStyledString_abi_cxx11_((string *)&watchpoints,&value);
                  (**connection->_vptr_cmConnection)(connection,&watchpoints);
                  std::__cxx11::string::~string((string *)&watchpoints);
                }
                else {
                  Json::Value::Value(&local_200,"Improper command for paused context");
                  pVVar6 = Json::Value::operator[](&value,"Error");
                  Json::Value::operator=(pVVar6,&local_200);
                  Json::Value::~Value(&local_200);
                  Json::Value::toStyledString_abi_cxx11_(&requestVal,&value);
                  (**connection->_vptr_cmConnection)(connection,&requestVal);
                }
                goto LAB_004282f8;
              }
              cmPauseContext::Step(&ctx);
            }
          }
        }
      }
      else {
        Json::Value::Value(&local_188,"Improper command for running context");
        pVVar6 = Json::Value::operator[](&value,"Error");
        Json::Value::operator=(pVVar6,&local_188);
        Json::Value::~Value(&local_188);
        Json::Value::toStyledString_abi_cxx11_(&requestVal,&value);
        (**connection->_vptr_cmConnection)(connection,&requestVal);
LAB_004282f8:
        std::__cxx11::string::~string((string *)&requestVal);
      }
      std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&ctx.Lock);
    }
  }
  std::__cxx11::string::~string((string *)&request);
LAB_00428268:
  Json::Value::~Value(&value);
  Json::Reader::~Reader(&reader);
  return;
}

Assistant:

void cmDebugServerJson::ProcessRequest(cmConnection* connection,
                                       const std::string& jsonRequest)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(jsonRequest, value)) {
    return;
  }

  auto request = value["Command"].asString();

  if (request == "Break") {
    Debugger.Break();
  } else if (request.find("ClearBreakpoints") == 0) {
    Debugger.ClearAllBreakpoints();
  } else if (request.find("RemoveBreakpoint") == 0) {
    Debugger.ClearBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddBreakpoint") == 0) {
    Debugger.SetBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddWatchpoint") == 0) {
    auto type = value["Type"].asString();
    cmWatchpoint::WatchpointType watchpointType =
      cmWatchpoint::WATCHPOINT_WRITE;
    if (type == "Read") {
      watchpointType = cmWatchpoint::WATCHPOINT_READ;
    } else if (type == "All") {
      watchpointType = cmWatchpoint::WATCHPOINT_ALL;
    }

    Debugger.SetWatchpoint(value["Expr"].asString(), watchpointType);
  } else if (request.find("RemoveWatchpoint") == 0) {
    auto expr = value["Expr"].asString();
    auto watchpoints = Debugger.GetWatchpoints();
    std::vector<watchpoint_id> removeList;
    removeList.reserve(watchpoints.size());
    for (auto& watchpoint : watchpoints) {
      if (watchpoint.Variable == expr) {
        removeList.push_back(watchpoint.Id);
      }
    }

    for (auto& w_id : removeList) {
      Debugger.ClearWatchpoint(w_id);
    }
  } else if (request.find("ClearWatchpoints") == 0) {
    Debugger.ClearAllWatchpoints();
  } else {

    auto ctx = Debugger.PauseContext();
    if (!ctx) {
      value["Error"] = "Improper command for running context";
      connection->WriteData(value.toStyledString());
      return;
    }

    if (request == "Continue") {
      ctx.Continue();
    } else if (request == "StepIn") {
      ctx.StepIn();
    } else if (request == "StepOut") {
      ctx.StepOut();
    } else if (request == "StepOver") {
      ctx.Step();
    } else if (request.find("Evaluate") == 0) {
      auto requestVal = value["Request"].asString();
      const char* v = CM_NULLPTR;
      if (!requestVal.empty() && requestVal[0] == '"' &&
          requestVal.back() == '"') {
        v = ctx.GetMakefile()->ExpandVariablesInString(requestVal);
      } else {
        v = ctx.GetMakefile()->GetDefinition(requestVal);
      }

      value.removeMember("Command");
      if (v) {
        value["Response"] = std::string(v);
      } else {
        value["Response"] = false;
      }
      connection->WriteData(value.toStyledString());
    } else {
      value["Error"] = "Improper command for paused context";
      connection->WriteData(value.toStyledString());
      return;
    }
  }
}